

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

bool __thiscall QDateTimeEditPrivate::isSeparatorKey(QDateTimeEditPrivate *this,QKeyEvent *ke)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = *(Data **)(ke + 0x28);
  local_40.ptr = *(char16_t **)(ke + 0x30);
  local_40.size = *(qsizetype *)(ke + 0x38);
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((local_40.size == 0) ||
     (iVar1 = *(int *)&this->field_0x3e0, *(long *)&this->field_0x418 <= (long)iVar1 + 1)) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (-1 < iVar1) {
      uVar4 = QDateTimeParser::fieldInfo((int)this + 0x3d8);
      if ((uVar4 & 1) == 0) {
        local_40.d = *(Data **)(ke + 0x28);
        local_40.ptr = *(char16_t **)(ke + 0x30);
        local_40.size = *(qsizetype *)(ke + 0x38);
        if (local_40.d != (Data *)0x0) {
          LOCK();
          ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        bVar3 = QChar::isLetterOrNumber((uint)(ushort)*local_40.ptr);
      }
      else {
        local_40.d = *(Data **)(ke + 0x28);
        local_40.ptr = *(char16_t **)(ke + 0x30);
        local_40.size = *(qsizetype *)(ke + 0x38);
        if (local_40.d != (Data *)0x0) {
          LOCK();
          ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        bVar3 = QChar::isNumber((uint)(ushort)*local_40.ptr);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      if (bVar3 == false) {
        iVar1 = *(int *)&this->field_0x3e0;
        lVar2 = *(long *)&this->field_0x428;
        local_40.d = *(Data **)(ke + 0x28);
        local_40.ptr = *(char16_t **)(ke + 0x30);
        local_40.size = *(qsizetype *)(ke + 0x38);
        if (local_40.d != (Data *)0x0) {
          LOCK();
          ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        bVar3 = QString::contains((QString *)(lVar2 + (long)iVar1 * 0x18 + 0x18),
                                  (QString *)&local_40,CaseSensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
        goto LAB_003c0d67;
      }
    }
  }
  bVar3 = false;
LAB_003c0d67:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDateTimeEditPrivate::isSeparatorKey(const QKeyEvent *ke) const
{
    if (!ke->text().isEmpty() && currentSectionIndex + 1 < sectionNodes.size() && currentSectionIndex >= 0) {
        if (fieldInfo(currentSectionIndex) & Numeric) {
            if (ke->text().at(0).isNumber())
                return false;
        } else if (ke->text().at(0).isLetterOrNumber()) {
            return false;
        }
        return separators.at(currentSectionIndex + 1).contains(ke->text());
    }
    return false;
}